

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_param_ref.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformParamRef(Transformer *this,PGParamRef *node)

{
  string *identifier;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> _Var1;
  idx_t iVar2;
  size_type sVar3;
  pointer pPVar4;
  idx_t iVar5;
  ParserException *this_00;
  long in_RDX;
  allocator local_c1;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> local_c0;
  idx_t known_param_index;
  string local_98;
  PreparedParam param;
  string local_50;
  
  make_uniq<duckdb::ParameterExpression>();
  param.identifier._M_dataplus._M_p = (pointer)&param.identifier.field_2;
  param.identifier._M_string_length = 0;
  identifier = &param.identifier;
  param.identifier.field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(int *)(in_RDX + 4) < 0) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_98,"Parameter numbers cannot be negative",
                 (allocator *)&known_param_index);
      ParserException::ParserException(this_00,&local_98);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string((string *)&known_param_index,"%d",&local_c1);
    Exception::ConstructMessage<int>(&local_98,(string *)&known_param_index,*(int *)(in_RDX + 4));
    ::std::__cxx11::string::operator=((string *)identifier,(string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&known_param_index);
    param.type = *(int *)(in_RDX + 4) != 0;
  }
  else {
    param.type = NAMED;
    ::std::__cxx11::string::assign((char *)identifier);
  }
  known_param_index = 0xffffffffffffffff;
  GetParam((Transformer *)node,identifier,&known_param_index,param.type);
  if (known_param_index == 0xffffffffffffffff) {
    if (*(int *)(in_RDX + 4) == 0) {
      iVar2 = ParamCount((Transformer *)node);
      known_param_index = iVar2 + 1;
      if (*(long *)(in_RDX + 0x10) == 0) {
        ::std::__cxx11::string::string((string *)&local_50,"%d",&local_c1);
        Exception::ConstructMessage<unsigned_long>(&local_98,&local_50,known_param_index);
        ::std::__cxx11::string::operator=((string *)identifier,(string *)&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      known_param_index = NumericCastImpl<unsigned_long,_int,_false>::Convert(*(int *)(in_RDX + 4));
    }
    sVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(node + 1),identifier);
    if (sVar3 == 0) {
      SetParam((Transformer *)node,identifier,known_param_index,param.type);
    }
  }
  pPVar4 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_c0);
  ::std::__cxx11::string::_M_assign((string *)&pPVar4->identifier);
  iVar5 = ParamCount((Transformer *)node);
  iVar2 = known_param_index;
  if (known_param_index < iVar5) {
    iVar2 = iVar5;
  }
  SetParamCount((Transformer *)node,iVar2);
  _Var1._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (ParameterExpression *)0x0;
  (this->parent).ptr = (Transformer *)_Var1._M_head_impl;
  ::std::__cxx11::string::~string((string *)identifier);
  if (local_c0._M_head_impl != (ParameterExpression *)0x0) {
    (*((local_c0._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformParamRef(duckdb_libpgquery::PGParamRef &node) {
	auto expr = make_uniq<ParameterExpression>();

	auto param = GetParameterIdentifier(node);
	idx_t known_param_index = DConstants::INVALID_INDEX;
	// This is a named parameter, try to find an entry for it
	GetParam(param.identifier, known_param_index, param.type);

	if (known_param_index == DConstants::INVALID_INDEX) {
		// We have not seen this parameter before
		if (node.number != 0) {
			// Preserve the parameter number
			known_param_index = NumericCast<idx_t>(node.number);
		} else {
			known_param_index = ParamCount() + 1;
			if (!node.name) {
				param.identifier = StringUtil::Format("%d", known_param_index);
			}
		}

		if (!named_param_map.count(param.identifier)) {
			// Add it to the named parameter map so we can find it next time it's referenced
			SetParam(param.identifier, known_param_index, param.type);
		}
	}

	expr->identifier = param.identifier;
	idx_t new_param_count = MaxValue<idx_t>(ParamCount(), known_param_index);
	SetParamCount(new_param_count);
	return std::move(expr);
}